

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_mesh.hpp
# Opt level: O3

int __thiscall
sisl::utility::ply_mesh::add_triangle(ply_mesh *this,vertex3 *v1,vertex3 *v2,vertex3 *v3)

{
  vector<sisl::vertex3,_std::allocator<sisl::vertex3>_> *this_00;
  iterator __position;
  _Tuple_impl<1UL,_int,_int> _Var1;
  pointer ptVar2;
  tuple<int,_int,_int> local_2c;
  
  this_00 = &this->verts;
  std::vector<sisl::vertex3,_std::allocator<sisl::vertex3>_>::push_back(this_00,v1);
  local_2c.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl =
       this->m_currentIndex;
  this->m_currentIndex =
       local_2c.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>._M_head_impl
       + 1;
  std::vector<sisl::vertex3,_std::allocator<sisl::vertex3>_>::push_back(this_00,v2);
  local_2c.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = this->m_currentIndex;
  this->m_currentIndex =
       local_2c.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
       super__Head_base<1UL,_int,_false>._M_head_impl + 1;
  std::vector<sisl::vertex3,_std::allocator<sisl::vertex3>_>::push_back(this_00,v3);
  local_2c.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
       (_Head_base<2UL,_int,_false>)this->m_currentIndex;
  this->m_currentIndex =
       (int)local_2c.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
            super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl + 1;
  __position._M_current =
       (this->faces).
       super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->faces).
      super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>>::
    _M_realloc_insert<std::tuple<int,int,int>const&>
              ((vector<std::tuple<int,int,int>,std::allocator<std::tuple<int,int,int>>> *)
               &this->faces,__position,&local_2c);
    ptVar2 = (this->faces).
             super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    ((__position._M_current)->super__Tuple_impl<0UL,_int,_int,_int>).
    super__Head_base<0UL,_int,_false>._M_head_impl =
         local_2c.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
         _M_head_impl;
    _Var1.super__Head_base<1UL,_int,_false>._M_head_impl =
         local_2c.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
         super__Head_base<1UL,_int,_false>._M_head_impl;
    _Var1.super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
         local_2c.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
         super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl;
    ((__position._M_current)->super__Tuple_impl<0UL,_int,_int,_int>).
    super__Tuple_impl<1UL,_int,_int> = _Var1;
    ptVar2 = (this->faces).
             super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->faces).
    super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = ptVar2;
  }
  return (int)((ulong)((long)ptVar2 -
                      (long)(this->faces).
                            super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555 + -1;
}

Assistant:

int add_triangle(vertex3 v1, vertex3 v2, vertex3 v3) {
            std::tuple<int,int,int> f;

            #pragma omp critical (add_face)
            {
                std::get<0>(f) = add_vertex(v1);
                std::get<1>(f) = add_vertex(v2);
                std::get<2>(f) = add_vertex(v3);

                faces.push_back(f);
            }
            return int(faces.size())-1;
        }